

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O2

void __thiscall
icu_63::SimpleDateFormat::parseInt
          (SimpleDateFormat *this,UnicodeString *text,Formattable *number,int32_t maxDigits,
          ParsePosition *pos,UBool allowNegative,NumberFormat *fmt)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  NumberFormat *pNVar4;
  int iVar5;
  int iVar6;
  ConstChar16Ptr local_c8;
  char16_t *local_c0;
  UnicodeString local_b0;
  UnicodeString oldPrefix;
  
  oldPrefix.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  oldPrefix.fUnion.fStackFields.fLengthAndFlags = 2;
  pNVar4 = (NumberFormat *)0x0;
  plVar2 = (long *)__dynamic_cast(fmt,&NumberFormat::typeinfo,&DecimalFormat::typeinfo,0);
  if (plVar2 != (long *)0x0 && allowNegative == '\0') {
    lVar3 = (**(code **)(*plVar2 + 0x20))(plVar2);
    if (lVar3 == 0) goto LAB_002b9420;
    pNVar4 = (NumberFormat *)__dynamic_cast(lVar3,&Format::typeinfo,&DecimalFormat::typeinfo,0);
    if (pNVar4 == (NumberFormat *)0x0) goto LAB_002b9420;
    local_c8.p_ = L"꬀";
    icu_63::UnicodeString::UnicodeString(&local_b0,'\x01',&local_c8,-1);
    (*(pNVar4->super_Format).super_UObject._vptr_UObject[0x2e])(pNVar4,&local_b0);
    icu_63::UnicodeString::~UnicodeString(&local_b0);
    local_c0 = local_c8.p_;
    fmt = pNVar4;
  }
  iVar1 = pos->index;
  (*(fmt->super_Format).super_UObject._vptr_UObject[0x14])(fmt,text,number,pos);
  if ((0 < maxDigits) &&
     (iVar5 = pos->index - iVar1, iVar6 = iVar5 - maxDigits, iVar6 != 0 && maxDigits <= iVar5)) {
    iVar5 = *(int *)&number->fValue;
    for (; 0 < iVar6; iVar6 = iVar6 + -1) {
      iVar5 = iVar5 / 10;
    }
    pos->index = iVar1 + maxDigits;
    Formattable::setLong(number,iVar5);
  }
  if (pNVar4 != (NumberFormat *)0x0) {
    (*(pNVar4->super_Format).super_UObject._vptr_UObject[1])(pNVar4);
  }
LAB_002b9420:
  icu_63::UnicodeString::~UnicodeString(&oldPrefix);
  return;
}

Assistant:

void SimpleDateFormat::parseInt(const UnicodeString& text,
                                Formattable& number,
                                int32_t maxDigits,
                                ParsePosition& pos,
                                UBool allowNegative,
                                const NumberFormat *fmt) const {
    UnicodeString oldPrefix;
    auto* fmtAsDF = dynamic_cast<const DecimalFormat*>(fmt);
    LocalPointer<DecimalFormat> df;
    if (!allowNegative && fmtAsDF != nullptr) {
        df.adoptInstead(dynamic_cast<DecimalFormat*>(fmtAsDF->clone()));
        if (df.isNull()) {
            // Memory allocation error
            return;
        }
        df->setNegativePrefix(UnicodeString(TRUE, SUPPRESS_NEGATIVE_PREFIX, -1));
        fmt = df.getAlias();
    }
    int32_t oldPos = pos.getIndex();
    fmt->parse(text, number, pos);

    if (maxDigits > 0) {
        // adjust the result to fit into
        // the maxDigits and move the position back
        int32_t nDigits = pos.getIndex() - oldPos;
        if (nDigits > maxDigits) {
            int32_t val = number.getLong();
            nDigits -= maxDigits;
            while (nDigits > 0) {
                val /= 10;
                nDigits--;
            }
            pos.setIndex(oldPos + maxDigits);
            number.setLong(val);
        }
    }
}